

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O0

MPP_RET mpp_trie_check(MppTrie trie,char *log)

{
  long lVar1;
  char *name_00;
  MppTrieNode *pMVar2;
  RK_S32 local_64;
  MppTrieNode *node;
  char *name;
  RK_S32 i;
  char *buf;
  MppTrieImpl *p;
  char *log_local;
  MppTrie trie_local;
  
  lVar1 = *(long *)((long)trie + 0x40);
  name._4_4_ = 0;
  while( true ) {
    if (*(int *)((long)trie + 0x18) <= name._4_4_) {
      return MPP_OK;
    }
    name_00 = (char *)(lVar1 + *(int *)(*(long *)((long)trie + 0x20) + (long)name._4_4_ * 0x14 +
                                       0x10));
    pMVar2 = mpp_trie_get_node(*(MppTrieNode **)((long)trie + 0x30),name_00);
    if (((pMVar2 == (MppTrieNode *)0x0) || (pMVar2->id < 0)) || (pMVar2->id != name._4_4_)) break;
    name._4_4_ = name._4_4_ + 1;
  }
  if (pMVar2 == (MppTrieNode *)0x0) {
    local_64 = -1;
  }
  else {
    local_64 = pMVar2->id;
  }
  _mpp_log_l(2,"mpp_trie","trie check on %s found mismatch info %s %d - %d\n",(char *)0x0,log,
             name_00,name._4_4_,local_64);
  return MPP_NOK;
}

Assistant:

static MPP_RET mpp_trie_check(MppTrie trie, const char *log)
{
    MppTrieImpl *p = (MppTrieImpl *)trie;
    char *buf = (char *)p->name_buf;
    RK_S32 i;

    for (i = 0; i < p->info_used; i++) {
        const char *name = buf + p->info[i].name_offset;
        MppTrieNode *node = mpp_trie_get_node(p->nodes, name);

        if (node && node->id >= 0 && node->id == i)
            continue;

        mpp_loge("trie check on %s found mismatch info %s %d - %d\n",
                 log, name, i, node ? node->id : -1);
        return MPP_NOK;
    }

    return MPP_OK;
}